

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

uint8 * __thiscall
sentencepiece::SelfTestData::_InternalSerialize
          (SelfTestData *this,uint8 *target,EpsCopyOutputStream *stream)

{
  void *pvVar1;
  bool bVar2;
  Type *this_00;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int index;
  size_t __n;
  uint8 *puVar7;
  uint8 *puVar8;
  
  iVar6 = (this->samples_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar6 != 0) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<sentencepiece::SelfTestData_Sample>::TypeHandler>
                          (&(this->samples_).super_RepeatedPtrFieldBase,index);
      *target = '\n';
      uVar4 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar4 < 0x80) {
        target[1] = (byte)uVar4;
        puVar7 = target + 2;
      }
      else {
        target[1] = (byte)uVar4 | 0x80;
        if (uVar4 < 0x4000) {
          target[2] = (uint8)(uVar4 >> 7);
          puVar7 = target + 3;
        }
        else {
          puVar7 = target + 3;
          uVar4 = uVar4 >> 7;
          do {
            puVar8 = puVar7;
            puVar8[-1] = (byte)uVar4 | 0x80;
            uVar5 = uVar4 >> 7;
            puVar7 = puVar8 + 1;
            bVar2 = 0x3fff < uVar4;
            uVar4 = uVar5;
          } while (bVar2);
          *puVar8 = (uint8)uVar5;
        }
      }
      target = SelfTestData_Sample::_InternalSerialize(this_00,puVar7,stream);
      index = index + 1;
    } while (index != iVar6);
  }
  puVar7 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&this->_extensions_,200,0x20000000,target,stream);
  pvVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    uVar3 = (ulong)pvVar1 & 0xfffffffffffffffe;
    pvVar1 = *(void **)(uVar3 + 8);
    iVar6 = (int)*(undefined8 *)(uVar3 + 0x10);
    __n = (size_t)iVar6;
    if ((long)stream->end_ - (long)puVar7 < (long)__n) {
      puVar7 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar1,iVar6,puVar7);
      return puVar7;
    }
    memcpy(puVar7,pvVar1,__n);
    puVar7 = puVar7 + __n;
  }
  return puVar7;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* SelfTestData::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.SelfTestData)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .sentencepiece.SelfTestData.Sample samples = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_samples_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_samples(i), target, stream);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.SelfTestData)
  return target;
}